

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O2

pair<const_slang::ast::Statement_*,_bool> __thiscall
slang::ast::CaseStatement::getKnownBranch(CaseStatement *this,EvalContext *context)

{
  UniquePriorityCheck UVar1;
  pointer ppEVar2;
  size_t sVar3;
  ValueRangeExpression *this_00;
  SourceRange range;
  __index_type _Var4;
  logic_t lVar5;
  bool bVar6;
  pointer pIVar7;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_01;
  Diagnostic *pDVar8;
  pointer pIVar9;
  char *pcVar10;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__return_storage_ptr__;
  ulong uVar11;
  Statement *pSVar12;
  long lVar13;
  pair<const_slang::ast::Statement_*,_bool> pVar14;
  string_view arg;
  ConstantValue val;
  ConstantValue cv;
  Type *local_c0;
  SourceLocation local_b0;
  SourceLocation local_a8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  __return_storage_ptr__ = &local_58;
  Expression::eval((ConstantValue *)__return_storage_ptr__,this->expr,context);
  if (local_58._M_index == '\0') {
    if (this->expr->kind != TypeReference) {
LAB_003e3767:
      pSVar12 = (Statement *)0x0;
      uVar11 = 0;
      goto LAB_003e376c;
    }
    local_c0 = *(Type **)(this->expr + 1);
  }
  else {
    local_c0 = (Type *)0x0;
  }
  UVar1 = this->check;
  pIVar9 = (this->items)._M_ptr;
  pIVar7 = pIVar9 + (this->items)._M_extent._M_extent_value;
  local_a8 = (SourceLocation)0x0;
  local_b0 = (SourceLocation)0x0;
  pSVar12 = (Statement *)0x0;
  do {
    if (pIVar9 == pIVar7) {
      uVar11 = CONCAT71((int7)((ulong)__return_storage_ptr__ >> 8),1);
      if ((pSVar12 == (Statement *)0x0) &&
         (pSVar12 = this->defaultCase, pSVar12 == (Statement *)0x0)) {
        if ((this->check | Unique0) == Priority) {
          pDVar8 = EvalContext::addDiag(context,(DiagCode)0x13000c,this->expr->sourceRange);
          bVar6 = this->check == Priority;
          pcVar10 = "unique";
          if (bVar6) {
            pcVar10 = "priority";
          }
          arg._M_str = pcVar10;
          arg._M_len = (ulong)bVar6 * 2 + 6;
          Diagnostic::operator<<(pDVar8,arg);
          Diagnostic::operator<<(pDVar8,(ConstantValue *)&local_58);
        }
        pSVar12 = (Statement *)0x0;
      }
      goto LAB_003e376c;
    }
    ppEVar2 = (pIVar9->expressions)._M_ptr;
    sVar3 = (pIVar9->expressions)._M_extent._M_extent_value;
    lVar13 = 0;
    do {
      if (sVar3 << 3 == lVar13) goto LAB_003e374b;
      this_00 = *(ValueRangeExpression **)((long)ppEVar2 + lVar13);
      if ((this_00->super_Expression).kind == ValueRange) {
        ValueRangeExpression::checkInside
                  ((ConstantValue *)&local_80,this_00,context,(ConstantValue *)&local_58);
        _Var4 = local_80._M_index;
        if (local_80._M_index != '\0') {
          this_01 = std::
                    get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                *)&local_80);
          lVar5 = SVInt::reductionOr(this_01);
          __return_storage_ptr__ =
               (_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)(ulong)((lVar5.value != '\0' && lVar5.value != 0x80) && lVar5.value != '@');
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_80);
        if (_Var4 == '\0') goto LAB_003e3767;
      }
      else {
        Expression::eval((ConstantValue *)&local_80,&this_00->super_Expression,context);
        if (local_80._M_index == '\0') {
          if ((local_c0 != (Type *)0x0) && ((this_00->super_Expression).kind == TypeReference)) {
            bVar6 = Type::isMatching(*(Type **)&this_00->rangeKind,local_c0);
            goto LAB_003e36cb;
          }
          bVar6 = false;
        }
        else {
          bVar6 = checkMatch(this->condition,(ConstantValue *)&local_58,(ConstantValue *)&local_80);
LAB_003e36cb:
          __return_storage_ptr__ =
               (_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)(ulong)bVar6;
          bVar6 = true;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_80);
        if (!bVar6) goto LAB_003e3767;
      }
      lVar13 = lVar13 + 8;
      uVar11 = (ulong)__return_storage_ptr__ & 1;
      __return_storage_ptr__ =
           (_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            *)0x0;
    } while (uVar11 == 0);
    if (pSVar12 != (Statement *)0x0) {
      pDVar8 = EvalContext::addDiag
                         (context,(DiagCode)0x3000c,(this_00->super_Expression).sourceRange);
      pDVar8 = Diagnostic::operator<<(pDVar8,(ConstantValue *)&local_58);
      uVar11 = 1;
      range.endLoc = local_a8;
      range.startLoc = local_b0;
      Diagnostic::addNote(pDVar8,(DiagCode)0xb0001,range);
      goto LAB_003e376c;
    }
    pSVar12 = (pIVar9->stmt).ptr;
    local_b0 = (this_00->super_Expression).sourceRange.startLoc;
    local_a8 = (this_00->super_Expression).sourceRange.endLoc;
    __return_storage_ptr__ =
         (_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          *)0x1;
LAB_003e374b:
    pIVar9 = pIVar9 + 1;
  } while ((pSVar12 == (Statement *)0x0) || (UVar1 - Unique < 2));
  uVar11 = CONCAT71((int7)((ulong)__return_storage_ptr__ >> 8),1);
LAB_003e376c:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  pVar14._8_8_ = uVar11 & 0xffffffff;
  pVar14.first = pSVar12;
  return pVar14;
}

Assistant:

std::pair<const Statement*, bool> CaseStatement::getKnownBranch(EvalContext& context) const {
    const Type* condType = nullptr;
    auto cv = expr.eval(context);
    if (!cv) {
        if (expr.kind == ExpressionKind::TypeReference)
            condType = &expr.as<TypeReferenceExpression>().targetType;
        else
            return {nullptr, false};
    }

    const Statement* matchedStmt = nullptr;
    SourceRange matchRange;
    bool unique = check == UniquePriorityCheck::Unique || check == UniquePriorityCheck::Unique0;

    for (auto& group : items) {
        for (auto item : group.expressions) {
            bool matched;
            if (item->kind == ExpressionKind::ValueRange) {
                ConstantValue val = item->as<ValueRangeExpression>().checkInside(context, cv);
                if (!val)
                    return {nullptr, false};

                matched = (bool)(logic_t)val.integer();
            }
            else {
                auto val = item->eval(context);
                if (val)
                    matched = checkMatch(condition, cv, val);
                else if (condType && item->kind == ExpressionKind::TypeReference)
                    matched = item->as<TypeReferenceExpression>().targetType.isMatching(*condType);
                else
                    return {nullptr, false};
            }

            if (matched) {
                // If we already matched with a previous item, the only we reason
                // we'd still get here is to check for uniqueness. The presence of
                // another match means we failed the uniqueness check.
                if (matchedStmt) {
                    auto& diag =
                        context.addDiag(diag::ConstEvalCaseItemsNotUnique, item->sourceRange) << cv;
                    diag.addNote(diag::NotePreviousMatch, matchRange);
                    unique = false;
                }
                else {
                    // Always break out of the item group once we find a match -- even when
                    // checking uniqueness, expressions in a single group are not required
                    // to be unique.
                    matchedStmt = group.stmt;
                    matchRange = item->sourceRange;
                }
                break;
            }
        }

        if (matchedStmt && !unique)
            break;
    }

    if (!matchedStmt)
        matchedStmt = defaultCase;

    if (!matchedStmt &&
        (check == UniquePriorityCheck::Priority || check == UniquePriorityCheck::Unique)) {

        auto& diag = context.addDiag(diag::ConstEvalNoCaseItemsMatched, expr.sourceRange);
        diag << (check == UniquePriorityCheck::Priority ? "priority"sv : "unique"sv);
        diag << cv;
    }

    return {matchedStmt, true};
}